

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O0

Orphan<capnp::AnyPointer> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::AnyPointer::Reader>
          (Orphan<capnp::AnyPointer> *__return_storage_ptr__,Orphanage *this,Reader copyFrom)

{
  BuilderArena *dst;
  EVP_PKEY_CTX *src;
  PointerReader local_58;
  OrphanBuilder local_38;
  Orphanage *local_18;
  Orphanage *this_local;
  
  dst = this->arena;
  src = (EVP_PKEY_CTX *)this->capTable;
  local_18 = this;
  this_local = (Orphanage *)__return_storage_ptr__;
  GetInnerReader<capnp::AnyPointer,_(capnp::Kind)7>::apply(&local_58,&copyFrom);
  _::OrphanBuilder::copy(&local_38,(EVP_PKEY_CTX *)dst,src);
  Orphan<capnp::AnyPointer>::Orphan(__return_storage_ptr__,&local_38);
  _::OrphanBuilder::~OrphanBuilder(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<FromReader<Reader>> Orphanage::newOrphanCopy(Reader copyFrom) const {
  return Orphan<FromReader<Reader>>(_::OrphanBuilder::copy(
      arena, capTable, GetInnerReader<FromReader<Reader>>::apply(copyFrom)));
}